

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathContextPtr xmlXPathNewContext(xmlDocPtr doc)

{
  xmlXPathContextPtr ret;
  xmlDocPtr doc_local;
  
  doc_local = (xmlDocPtr)(*xmlMalloc)(0x178);
  if (doc_local == (xmlDocPtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    memset(doc_local,0,0x178);
    doc_local->_private = doc;
    *(undefined8 *)&doc_local->type = 0;
    doc_local->children = (_xmlNode *)0x0;
    *(undefined4 *)&doc_local->last = 0;
    *(undefined4 *)((long)&doc_local->last + 4) = 0;
    doc_local->parent = (_xmlNode *)0x0;
    *(undefined4 *)&doc_local->doc = 0;
    *(undefined4 *)((long)&doc_local->doc + 4) = 0;
    doc_local->compression = 0;
    doc_local->standalone = 0;
    doc_local->URL = (xmlChar *)0x0;
    doc_local->oldNs = (_xmlNs *)0x0;
    *(undefined4 *)&doc_local->version = 1;
    *(undefined4 *)((long)&doc_local->version + 4) = 1;
  }
  return (xmlXPathContextPtr)doc_local;
}

Assistant:

xmlXPathContextPtr
xmlXPathNewContext(xmlDocPtr doc) {
    xmlXPathContextPtr ret;

    ret = (xmlXPathContextPtr) xmlMalloc(sizeof(xmlXPathContext));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0 , sizeof(xmlXPathContext));
    ret->doc = doc;
    ret->node = NULL;

    ret->varHash = NULL;

    ret->nb_types = 0;
    ret->max_types = 0;
    ret->types = NULL;

    ret->nb_axis = 0;
    ret->max_axis = 0;
    ret->axis = NULL;

    ret->nsHash = NULL;
    ret->user = NULL;

    ret->contextSize = 1;
    ret->proximityPosition = 1;

#ifdef XP_DEFAULT_CACHE_ON
    if (xmlXPathContextSetCache(ret, 1, -1, 0) == -1) {
	xmlXPathFreeContext(ret);
	return(NULL);
    }
#endif

    return(ret);
}